

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::Arena::FreeBlocks(Arena *this)

{
  undefined8 *puVar1;
  Block *pBVar2;
  long lVar3;
  Block *pBVar4;
  uint64 uVar5;
  Block *b;
  long *in_FS_OFFSET;
  
  uVar5 = 0;
  pBVar2 = *(Block **)(this + 8);
  pBVar4 = (Block *)0x0;
  while (b = pBVar4, pBVar4 = pBVar2, pBVar4 != (Block *)0x0) {
    pBVar2 = pBVar4->next;
    uVar5 = uVar5 + pBVar4->size;
    if ((pBVar2 != (Block *)0x0) || (this[0x28] == (Arena)0x1)) {
      (**(code **)(this + 0x68))();
      pBVar4 = b;
    }
  }
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  if (this[0x28] == (Arena)0x0) {
    b->pos = 0x20;
    lVar3 = *in_FS_OFFSET;
    puVar1 = (undefined8 *)(lVar3 + -0x10);
    b->owner = puVar1;
    *(Block **)(lVar3 + -8) = b;
    *puVar1 = *(undefined8 *)this;
    AddBlockInternal(this,b);
  }
  return uVar5;
}

Assistant:

uint64 Arena::FreeBlocks() {
  uint64 space_allocated = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  Block* first_block = NULL;
  while (b != NULL) {
    space_allocated += (b->size);
    Block* next = b->next;
    if (next != NULL) {
#ifdef ADDRESS_SANITIZER
      // This memory was provided by the underlying allocator as unpoisoned, so
      // return it in an unpoisoned state.
      ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
      options_.block_dealloc(b, b->size);
    } else {
      if (owns_first_block_) {
#ifdef ADDRESS_SANITIZER
        // This memory was provided by the underlying allocator as unpoisoned,
        // so return it in an unpoisoned state.
        ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
        options_.block_dealloc(b, b->size);
      } else {
        // User passed in the first block, skip free'ing the memory.
        first_block = b;
      }
    }
    b = next;
  }
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  if (!owns_first_block_) {
    // Make the first block that was passed in through ArenaOptions
    // available for reuse.
    first_block->pos = kHeaderSize;
    // Thread which calls Reset() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
  }
  return space_allocated;
}